

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

int xmlNewInputFromUrl(char *filename,int flags,xmlParserInputPtr *out)

{
  int iVar1;
  xmlParserInputBufferCreateFilenameFunc *pp_Var2;
  xmlParserInputPtr pxVar3;
  xmlParserInputBufferPtr buf;
  
  iVar1 = 0x73;
  if ((out != (xmlParserInputPtr *)0x0) && (*out = (xmlParserInputPtr)0x0, filename != (char *)0x0))
  {
    pp_Var2 = __xmlParserInputBufferCreateFilenameValue();
    if (*pp_Var2 == (xmlParserInputBufferCreateFilenameFunc)0x0) {
      iVar1 = xmlParserInputBufferCreateUrl(filename,XML_CHAR_ENCODING_NONE,flags,&buf);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    else {
      pp_Var2 = __xmlParserInputBufferCreateFilenameValue();
      buf = (**pp_Var2)(filename,XML_CHAR_ENCODING_NONE);
      if (buf == (xmlParserInputBufferPtr)0x0) {
        return 0x5f4;
      }
    }
    pxVar3 = xmlNewInputInternal(buf,filename);
    if (pxVar3 == (xmlParserInputPtr)0x0) {
      iVar1 = 2;
    }
    else {
      *out = pxVar3;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
xmlNewInputFromUrl(const char *filename, int flags, xmlParserInputPtr *out) {
    xmlParserInputBufferPtr buf;
    xmlParserInputPtr input;
    int code = XML_ERR_OK;

    if (out == NULL)
        return(XML_ERR_ARGUMENT);
    *out = NULL;
    if (filename == NULL)
        return(XML_ERR_ARGUMENT);

    if (xmlParserInputBufferCreateFilenameValue != NULL) {
        buf = xmlParserInputBufferCreateFilenameValue(filename,
                XML_CHAR_ENCODING_NONE);
        if (buf == NULL)
            code = XML_IO_ENOENT;
    } else {
        code = xmlParserInputBufferCreateUrl(filename, XML_CHAR_ENCODING_NONE,
                                             flags, &buf);
    }
    if (code != XML_ERR_OK)
	return(code);

    input = xmlNewInputInternal(buf, filename);
    if (input == NULL)
	return(XML_ERR_NO_MEMORY);

#ifdef LIBXML_HTTP_ENABLED
    code = xmlCheckHTTPInputInternal(input);
    if (code != XML_ERR_OK) {
        xmlFreeInputStream(input);
        return(code);
    }
#endif

    *out = input;
    return(XML_ERR_OK);
}